

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvPendulum_dns.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  N_Vector yref;
  N_Vector yy0;
  undefined8 *puVar3;
  void *returnvalue;
  void *returnvalue_00;
  int iVar4;
  long lVar5;
  bool bVar6;
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar8 [16];
  int retval;
  double local_88;
  int local_7c;
  undefined1 local_78 [24];
  void *local_60;
  void *local_58;
  void *local_50;
  sunrealtype local_48;
  sunrealtype sStack_40;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar4 = 1;
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 == 0) {
    local_78._0_8_ = 0x3ee4f8b588e368f1;
    local_88 = 30.0;
    iVar1 = 1;
    local_7c = 1;
    iVar4 = 1;
    dVar7 = 1e-05;
    while( true ) {
      while( true ) {
        while( true ) {
          lVar5 = (long)iVar4;
          while( true ) {
            local_78._8_8_ = dVar7;
            iVar4 = (int)lVar5;
            if (argc <= iVar4) {
              retval = 0;
              goto LAB_00102525;
            }
            __s1 = argv[lVar5];
            iVar2 = strcmp(__s1,"--tol");
            if (iVar2 != 0) break;
            local_78._0_8_ = atof(argv[lVar5 + 1]);
            local_78._8_8_ = extraout_XMM0_Qb;
            dVar7 = atof(argv[lVar5 + 2]);
            lVar5 = lVar5 + 3;
          }
          iVar2 = strcmp(__s1,"--tf");
          if (iVar2 != 0) break;
          iVar4 = iVar4 + 2;
          local_88 = atof(argv[lVar5 + 1]);
          dVar7 = (double)local_78._8_8_;
        }
        iVar2 = strcmp(__s1,"--nout");
        if (iVar2 != 0) break;
        iVar4 = iVar4 + 2;
        iVar1 = atoi(argv[lVar5 + 1]);
        dVar7 = (double)local_78._8_8_;
      }
      iVar2 = strcmp(__s1,"--noerrproj");
      if (iVar2 != 0) break;
      iVar4 = iVar4 + 1;
      local_7c = 0;
      dVar7 = (double)local_78._8_8_;
    }
    iVar4 = strcmp(__s1,"--help");
    if (iVar4 != 0) {
      fprintf(_stderr,"ERROR: Invalid input %s",__s1);
    }
    puts("\nCommand line options:");
    puts("  --tol <rtol> <atol> : relative and absolute tolerance");
    puts("  --tf <time>         : final simulation time");
    puts("  --nout <outputs>    : number of outputs");
    puts("  --noerrproj         : disable error projection");
    retval = -1;
LAB_00102525:
    iVar4 = 1;
    iVar2 = check_retval(&retval,"ReadInputs",1);
    if (iVar2 == 0) {
      yref = (N_Vector)N_VNew_Serial(4,sunctx);
      retval = RefSol(local_88,yref,iVar1);
      iVar4 = 1;
      iVar2 = check_retval(&retval,"RefSol",1);
      if (iVar2 == 0) {
        yy0 = (N_Vector)N_VNew_Serial(4,sunctx);
        iVar2 = check_retval(yy0,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          puVar3 = (undefined8 *)N_VGetArrayPointer(yy0);
          *puVar3 = 0x3ff0000000000000;
          puVar3[1] = 0;
          puVar3[2] = 0;
          puVar3[3] = 0;
          returnvalue = (void *)CVodeCreate(2,sunctx);
          local_50 = returnvalue;
          iVar2 = check_retval(returnvalue,"CVodeCreate",0);
          if (iVar2 == 0) {
            retval = CVodeInit(0,returnvalue,f,yy0);
            iVar4 = 1;
            iVar2 = check_retval(&retval,"CVodeInit",1);
            if (iVar2 == 0) {
              returnvalue_00 = (void *)SUNDenseMatrix(4,4,sunctx);
              iVar2 = check_retval(returnvalue_00,"SUNDenseMatrix",0);
              if (iVar2 == 0) {
                local_60 = (void *)SUNLinSol_Dense(yy0,returnvalue_00,sunctx);
                iVar2 = check_retval(local_60,"SUNLinSol_Dense",0);
                if (iVar2 == 0) {
                  retval = CVodeSetLinearSolver(returnvalue,local_60,returnvalue_00);
                  iVar4 = 1;
                  iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
                  if (iVar2 == 0) {
                    retval = CVodeSetProjFn(returnvalue,proj);
                    iVar4 = 1;
                    iVar2 = check_retval(&retval,"CVodeSetProjFn",1);
                    if (iVar2 == 0) {
                      retval = CVodeSetMaxNumSteps(returnvalue,50000);
                      iVar4 = 1;
                      iVar2 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
                      if (iVar2 == 0) {
                        iVar4 = 5;
                        auVar8 = local_78._0_16_;
                        local_58 = returnvalue_00;
                        while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
                          local_48 = auVar8._8_8_;
                          local_78._0_16_ = auVar8;
                          sStack_40 = local_48;
                          printf("\n\nrtol = %8.2e, atol = %8.2e\n");
                          printf("Project    x         y");
                          printf("         x\'        y\'     |     g      |    ");
                          puts("nst     rhs eval    setups (J eval)  |   cf   ef");
                          retval = GetSol(returnvalue,yy0,(sunrealtype)local_78._0_8_,local_48,
                                          local_88,iVar1,1,local_7c,yref);
                          iVar2 = check_retval(&retval,"GetSol",1);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          retval = GetSol(returnvalue,yy0,(sunrealtype)local_78._0_8_,local_48,
                                          local_88,iVar1,0,0,yref);
                          iVar2 = check_retval(&retval,"GetSol",1);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          auVar8 = divpd(local_78._0_16_,_DAT_00104020);
                        }
                        N_VDestroy_Serial(yref);
                        N_VDestroy_Serial(yy0);
                        SUNMatDestroy(local_58);
                        SUNLinSolFree(local_60);
                        CVodeFree(&local_50);
                        SUNContext_Free(&sunctx);
                        iVar4 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
  int i;
  int retval;                                  /* reusable return flag    */
  int nout               = 1;                  /* number of outputs       */
  sunrealtype rtol       = SUN_RCONST(1.0e-5); /* base relative tolerance */
  sunrealtype atol       = SUN_RCONST(1.0e-5); /* base absolute tolerance */
  sunrealtype tf         = SUN_RCONST(30.0);   /* final integration time  */
  sunbooleantype projerr = SUNTRUE;            /* enable error projection */

  void* cvode_mem      = NULL; /* CVODE memory              */
  N_Vector yy0         = NULL; /* initial condition vector  */
  sunrealtype* yy0data = NULL; /* vector data               */
  N_Vector yref        = NULL; /* reference solution vector */
  SUNMatrix A          = NULL; /* Jacobian matrix           */
  SUNLinearSolver LS   = NULL; /* linear solver             */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Read command line inputs */
  retval = ReadInputs(&argc, &argv, &rtol, &atol, &tf, &nout, &projerr);
  if (check_retval(&retval, "ReadInputs", 1)) { return (1); }

  /* Compute reference solution */
  yref = N_VNew_Serial(4, sunctx);

  retval = RefSol(tf, yref, nout);
  if (check_retval(&retval, "RefSol", 1)) { return (1); }

  /* Create serial vector to store the initial condition */
  yy0 = N_VNew_Serial(4, sunctx);
  if (check_retval((void*)yy0, "N_VNew_Serial", 0)) { return (1); }

  /* Set the initial condition values */
  yy0data = N_VGetArrayPointer(yy0);

  yy0data[0] = ONE;  /* x  */
  yy0data[1] = ZERO; /* y  */
  yy0data[2] = ZERO; /* xd */
  yy0data[3] = ZERO; /* yd */

  /* Create CVODE memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODE */
  retval = CVodeInit(cvode_mem, f, ZERO, yy0);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(4, 4, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy0, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODE */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied projection function */
  retval = CVodeSetProjFn(cvode_mem, proj);
  if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

  /* Set maximum number of steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 50000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Compute the solution with various tolerances */
  for (i = 0; i < 5; i++)
  {
    /* Output tolerance and output header for this run */
    printf("\n\nrtol = %8.2" ESYM ", atol = %8.2" ESYM "\n", rtol, atol);
    printf("Project    x         y");
    printf("         x'        y'     |     g      |    ");
    printf("nst     rhs eval    setups (J eval)  |   cf   ef\n");

    /* Compute solution with projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNTRUE, projerr, yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Compute solution without projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNFALSE, SUNFALSE,
                    yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Reduce tolerance for next run */
    rtol /= SUN_RCONST(10.0);
    atol /= SUN_RCONST(10.0);
  }

  /* Free memory */
  N_VDestroy_Serial(yref);
  N_VDestroy_Serial(yy0);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}